

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::_nodeAt(HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
          *this,size_t idx)

{
  ulong *puVar1;
  pointer pNVar2;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  uVar4 = this->_count;
  if (idx < uVar4) {
    lVar6 = (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = lVar6 >> 4;
    lVar6 = lVar6 + -8;
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      pNVar2 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar3 = *(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 **)((long)pNVar2 + lVar6 + -8);
      if (((pNVar3 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                       *)0x0) &&
          (puVar1 = (ulong *)((long)&pNVar2->pNode + lVar6), *puVar1 <= idx + 1)) &&
         (pNVar3 = Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                   ::at(pNVar3,(idx + 1) - *puVar1),
         pNVar3 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                    *)0x0)) {
        return pNVar3;
      }
      lVar6 = lVar6 + -0x10;
    }
    uVar4 = this->_count;
  }
  _throw_exceeds_size(uVar4);
  return (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
          *)0x0;
}

Assistant:

const Node<T, _Compare> *HeadNode<T, _Compare>::_nodeAt(size_t idx) const {
    if (idx < _count) {
        for (size_t l = _nodeRefs.height(); l-- > 0;) {
            if (_nodeRefs[l].pNode && _nodeRefs[l].width <= idx + 1) {
                size_t new_index = idx + 1 - _nodeRefs[l].width;
                const Node<T, _Compare> *pNode = _nodeRefs[l].pNode->at(new_index);
                if (pNode) {
                    return pNode;
                }
            }
        }
    }
    assert(idx >= _count);
    _throw_exceeds_size(_count);
    // Should not get here as _throw_exceeds_size() will always throw.
    return NULL;
}